

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

time_t Curl_getdate_capped(char *p)

{
  int iVar1;
  time_t tVar2;
  time_t local_8;
  
  local_8 = -1;
  iVar1 = parsedate(p,&local_8);
  tVar2 = local_8;
  if (iVar1 != 1) {
    if (iVar1 == 0) {
      tVar2 = 0;
      if (local_8 != -1) {
        tVar2 = local_8;
      }
    }
    else {
      tVar2 = -1;
    }
  }
  return tVar2;
}

Assistant:

time_t Curl_getdate_capped(const char *p)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);

  switch(rc) {
  case PARSEDATE_OK:
    if(parsed == (time_t)-1)
      /* avoid returning -1 for a working scenario */
      parsed++;
    return parsed;
  case PARSEDATE_LATER:
    /* this returns the maximum time value */
    return parsed;
  default:
    return -1; /* everything else is fail */
  }
  /* UNREACHABLE */
}